

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<char> * __thiscall
cimg_library::CImgList<char>::get_append
          (CImg<char> *__return_storage_ptr__,CImgList<char> *this,char axis,float align)

{
  bool bVar1;
  char cVar2;
  CImg<char> *pCVar3;
  char *pcVar4;
  uint *puVar5;
  CImg<char> *img_7;
  int l_7;
  CImg<char> *img_6;
  CImg<char> *pCStack_a0;
  int l_6;
  CImg<char> *img_5;
  int l_5;
  CImg<char> *img_4;
  CImg<char> *pCStack_80;
  int l_4;
  CImg<char> *img_3;
  int l_3;
  CImg<char> *img_2;
  CImg<char> *pCStack_60;
  int l_2;
  CImg<char> *img_1;
  int l_1;
  CImg<char> *img;
  int l;
  undefined1 local_35;
  uint local_34;
  uint local_30;
  uint pos;
  uint dc;
  uint dz;
  uint dy;
  uint dx;
  float align_local;
  char axis_local;
  CImgList<char> *this_local;
  CImg<char> *res;
  
  dy = (uint)align;
  dx._3_1_ = axis;
  _align_local = this;
  this_local = (CImgList<char> *)__return_storage_ptr__;
  bVar1 = is_empty(this);
  if (bVar1) {
    CImg<char>::CImg(__return_storage_ptr__);
  }
  else if (this->_width == 1) {
    pCVar3 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
    CImg<char>::operator+(__return_storage_ptr__,pCVar3);
  }
  else {
    dz = 0;
    dc = 0;
    pos = 0;
    local_30 = 0;
    local_34 = 0;
    local_35 = 0;
    CImg<char>::CImg(__return_storage_ptr__);
    cVar2 = cimg::lowercase(dx._3_1_);
    if (cVar2 == 'x') {
      for (img._0_4_ = 0; (int)img < (int)this->_width; img._0_4_ = (int)img + 1) {
        _l_1 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
        _l_1 = _l_1 + (int)img;
        pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)_l_1);
        if (pcVar4 != (char *)0x0) {
          dz = dz + _l_1->_width;
          puVar5 = std::max<unsigned_int>(&dc,&_l_1->_height);
          dc = *puVar5;
          puVar5 = std::max<unsigned_int>(&pos,&_l_1->_depth);
          pos = *puVar5;
          puVar5 = std::max<unsigned_int>(&local_30,&_l_1->_spectrum);
          local_30 = *puVar5;
        }
      }
      img_1._7_1_ = 0;
      CImg<char>::assign(__return_storage_ptr__,dz,dc,pos,local_30,(char *)((long)&img_1 + 7));
      pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)__return_storage_ptr__);
      if (pcVar4 != (char *)0x0) {
        for (img_1._0_4_ = 0; (int)img_1 < (int)this->_width; img_1._0_4_ = (int)img_1 + 1) {
          pCStack_60 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
          pCStack_60 = pCStack_60 + (int)img_1;
          pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)pCStack_60);
          if (pcVar4 != (char *)0x0) {
            if ((((pCStack_60->_height == 1) && (pCStack_60->_depth == 1)) &&
                (pCStack_60->_spectrum == 1)) &&
               (((__return_storage_ptr__->_height == 1 && (__return_storage_ptr__->_depth == 1)) &&
                (__return_storage_ptr__->_spectrum == 1)))) {
              pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)__return_storage_ptr__);
              memcpy(pcVar4 + local_34,pCStack_60->_data,(ulong)pCStack_60->_width);
            }
            else {
              CImg<char>::draw_image
                        (__return_storage_ptr__,local_34,
                         (int)((float)dy * (float)(dc - pCStack_60->_height)),
                         (int)((float)dy * (float)(pos - pCStack_60->_depth)),
                         (int)((float)dy * (float)(local_30 - pCStack_60->_spectrum)),pCStack_60,1.0
                        );
            }
          }
          local_34 = pCStack_60->_width + local_34;
        }
      }
    }
    else if (cVar2 == 'y') {
      for (img_2._4_4_ = 0; img_2._4_4_ < (int)this->_width; img_2._4_4_ = img_2._4_4_ + 1) {
        _l_3 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
        _l_3 = _l_3 + img_2._4_4_;
        pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)_l_3);
        if (pcVar4 != (char *)0x0) {
          puVar5 = std::max<unsigned_int>(&dz,&_l_3->_width);
          dz = *puVar5;
          dc = dc + _l_3->_height;
          puVar5 = std::max<unsigned_int>(&pos,&_l_3->_depth);
          pos = *puVar5;
          puVar5 = std::max<unsigned_int>(&local_30,&_l_3->_spectrum);
          local_30 = *puVar5;
        }
      }
      img_3._7_1_ = 0;
      CImg<char>::assign(__return_storage_ptr__,dz,dc,pos,local_30,(char *)((long)&img_3 + 7));
      pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)__return_storage_ptr__);
      if (pcVar4 != (char *)0x0) {
        for (img_3._0_4_ = 0; (int)img_3 < (int)this->_width; img_3._0_4_ = (int)img_3 + 1) {
          pCStack_80 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
          pCStack_80 = pCStack_80 + (int)img_3;
          pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)pCStack_80);
          if (pcVar4 != (char *)0x0) {
            if (((pCStack_80->_width == 1) && (pCStack_80->_depth == 1)) &&
               ((pCStack_80->_spectrum == 1 &&
                (((__return_storage_ptr__->_width == 1 && (__return_storage_ptr__->_depth == 1)) &&
                 (__return_storage_ptr__->_spectrum == 1)))))) {
              pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)__return_storage_ptr__);
              memcpy(pcVar4 + local_34,pCStack_80->_data,(ulong)pCStack_80->_height);
            }
            else {
              CImg<char>::draw_image
                        (__return_storage_ptr__,(int)((float)dy * (float)(dz - pCStack_80->_width)),
                         local_34,(int)((float)dy * (float)(pos - pCStack_80->_depth)),
                         (int)((float)dy * (float)(local_30 - pCStack_80->_spectrum)),pCStack_80,1.0
                        );
            }
          }
          local_34 = pCStack_80->_height + local_34;
        }
      }
    }
    else if (cVar2 == 'z') {
      for (img_4._4_4_ = 0; img_4._4_4_ < (int)this->_width; img_4._4_4_ = img_4._4_4_ + 1) {
        _l_5 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
        _l_5 = _l_5 + img_4._4_4_;
        pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)_l_5);
        if (pcVar4 != (char *)0x0) {
          puVar5 = std::max<unsigned_int>(&dz,&_l_5->_width);
          dz = *puVar5;
          puVar5 = std::max<unsigned_int>(&dc,&_l_5->_height);
          dc = *puVar5;
          pos = pos + _l_5->_depth;
          puVar5 = std::max<unsigned_int>(&local_30,&_l_5->_spectrum);
          local_30 = *puVar5;
        }
      }
      img_5._7_1_ = 0;
      CImg<char>::assign(__return_storage_ptr__,dz,dc,pos,local_30,(char *)((long)&img_5 + 7));
      pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)__return_storage_ptr__);
      if (pcVar4 != (char *)0x0) {
        for (img_5._0_4_ = 0; (int)img_5 < (int)this->_width; img_5._0_4_ = (int)img_5 + 1) {
          pCStack_a0 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
          pCStack_a0 = pCStack_a0 + (int)img_5;
          pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)pCStack_a0);
          if (pcVar4 != (char *)0x0) {
            if (((pCStack_a0->_width == 1) && (pCStack_a0->_height == 1)) &&
               (((pCStack_a0->_spectrum == 1 &&
                 ((__return_storage_ptr__->_width == 1 && (__return_storage_ptr__->_height == 1))))
                && (__return_storage_ptr__->_spectrum == 1)))) {
              pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)__return_storage_ptr__);
              memcpy(pcVar4 + local_34,pCStack_a0->_data,(ulong)pCStack_a0->_depth);
            }
            else {
              CImg<char>::draw_image
                        (__return_storage_ptr__,(int)((float)dy * (float)(dz - pCStack_a0->_width)),
                         (int)((float)dy * (float)(dc - pCStack_a0->_height)),local_34,
                         (int)((float)dy * (float)(local_30 - pCStack_a0->_spectrum)),pCStack_a0,1.0
                        );
            }
          }
          local_34 = pCStack_a0->_depth + local_34;
        }
      }
    }
    else {
      for (img_6._4_4_ = 0; img_6._4_4_ < (int)this->_width; img_6._4_4_ = img_6._4_4_ + 1) {
        _l_7 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
        _l_7 = _l_7 + img_6._4_4_;
        pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)_l_7);
        if (pcVar4 != (char *)0x0) {
          puVar5 = std::max<unsigned_int>(&dz,&_l_7->_width);
          dz = *puVar5;
          puVar5 = std::max<unsigned_int>(&dc,&_l_7->_height);
          dc = *puVar5;
          puVar5 = std::max<unsigned_int>(&pos,&_l_7->_depth);
          pos = *puVar5;
          local_30 = _l_7->_spectrum + local_30;
        }
      }
      img_7._7_1_ = 0;
      CImg<char>::assign(__return_storage_ptr__,dz,dc,pos,local_30,(char *)((long)&img_7 + 7));
      pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)__return_storage_ptr__);
      if (pcVar4 != (char *)0x0) {
        for (img_7._0_4_ = 0; (int)img_7 < (int)this->_width; img_7._0_4_ = (int)img_7 + 1) {
          pCVar3 = cimg_library::CImgList::operator_cast_to_CImg_((CImgList *)this);
          pCVar3 = pCVar3 + (int)img_7;
          pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)pCVar3);
          if (pcVar4 != (char *)0x0) {
            if (((((pCVar3->_width == 1) && (pCVar3->_height == 1)) && (pCVar3->_depth == 1)) &&
                ((__return_storage_ptr__->_width == 1 && (__return_storage_ptr__->_height == 1))))
               && (__return_storage_ptr__->_depth == 1)) {
              pcVar4 = cimg_library::CImg::operator_cast_to_char_((CImg *)__return_storage_ptr__);
              memcpy(pcVar4 + local_34,pCVar3->_data,(ulong)pCVar3->_spectrum);
            }
            else {
              CImg<char>::draw_image
                        (__return_storage_ptr__,(int)((float)dy * (float)(dz - pCVar3->_width)),
                         (int)((float)dy * (float)(dc - pCVar3->_height)),
                         (int)((float)dy * (float)(pos - pCVar3->_depth)),local_34,pCVar3,1.0);
            }
          }
          local_34 = pCVar3->_spectrum + local_34;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

CImg<T> get_append(const char axis, const float align=0) const {
      if (is_empty()) return CImg<T>();
      if (_width==1) return +((*this)[0]);
      unsigned int dx = 0, dy = 0, dz = 0, dc = 0, pos = 0;
      CImg<T> res;
      switch (cimg::lowercase(axis)) {
      case 'x' : { // Along the X-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx+=img._width;
            dy = std::max(dy,img._height);
            dz = std::max(dz,img._depth);
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._height==1 && img._depth==1 && img._spectrum==1 &&
                  res._height==1 && res._depth==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._width);
              else
                res.draw_image(pos,
                               (int)(align*(dy - img._height)),
                               (int)(align*(dz - img._depth)),
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._width;
          }
      } break;
      case 'y' : { // Along the Y-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy+=img._height;
            dz = std::max(dz,img._depth);
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._depth==1 && img._spectrum==1 &&
                  res._width==1 && res._depth==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._height);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               pos,
                               (int)(align*(dz - img._depth)),
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._height;
          }
      } break;
      case 'z' : { // Along the Z-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy = std::max(dy,img._height);
            dz+=img._depth;
            dc = std::max(dc,img._spectrum);
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._height==1 && img._spectrum==1 &&
                  res._width==1 && res._height==1 && res._spectrum==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._depth);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               (int)(align*(dy - img._height)),
                               pos,
                               (int)(align*(dc - img._spectrum)),
                               img);
            }
            pos+=img._depth;
          }
      } break;
      default : { // Along the C-axis
        cimglist_for(*this,l) {
          const CImg<T>& img = (*this)[l];
          if (img) {
            dx = std::max(dx,img._width);
            dy = std::max(dy,img._height);
            dz = std::max(dz,img._depth);
            dc+=img._spectrum;
          }
        }
        res.assign(dx,dy,dz,dc,(T)0);
        if (res) cimglist_for(*this,l) {
            const CImg<T>& img = (*this)[l];
            if (img) {
              if (img._width==1 && img._height==1 && img._depth==1 &&
                  res._width==1 && res._height==1 && res._depth==1)
                std::memcpy(&res[pos],img._data,sizeof(T)*img._spectrum);
              else
                res.draw_image((int)(align*(dx - img._width)),
                               (int)(align*(dy - img._height)),
                               (int)(align*(dz - img._depth)),
                               pos,
                               img);
            }
            pos+=img._spectrum;
          }
      }
      }
      return res;
    }